

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cSparseTextureTests.cpp
# Opt level: O0

bool __thiscall
gl4cts::SparseTextureAllocationTestCase::verifyTexStorageFullArrayCubeMipmapsError
          (SparseTextureAllocationTestCase *this,Functions *gl,GLint target,GLint format)

{
  GLint GVar1;
  GLint GVar2;
  bool bVar3;
  GLenum GVar4;
  GLenum GVar5;
  double dVar6;
  double dVar7;
  GLint height;
  GLint width;
  GLint levels;
  GLint pageSizeZ;
  GLint pageSizeY;
  GLint pageSizeX;
  GLuint GStack_30;
  GLboolean fullArrayCubeMipmaps;
  GLint depth;
  GLuint texture;
  GLenum GStack_24;
  bool result;
  GLint format_local;
  GLint target_local;
  Functions *gl_local;
  SparseTextureAllocationTestCase *this_local;
  
  texture = format;
  GStack_24 = target;
  _format_local = gl;
  gl_local = (Functions *)this;
  std::operator<<((ostream *)&this->field_0x88,"Verify FullArrayCubeMipmaps errors - ");
  depth._3_1_ = 1;
  pageSizeX = SparseTextureUtils::getTargetDepth(GStack_24);
  (*_format_local->getBooleanv)(0x91a9,(GLboolean *)((long)&pageSizeY + 3));
  GVar5 = GStack_24;
  GVar4 = (*_format_local->getError)();
  bVar3 = SparseTextureUtils::verifyQueryError(&this->mLog,"getBooleanv",GVar5,0x91a9,GVar4,0);
  if (!bVar3) {
    return false;
  }
  if (pageSizeY._3_1_ == '\0') {
    if ((((GStack_24 == 0x8c18) || (GStack_24 == 0x8c1a)) || (GStack_24 == 0x8513)) ||
       (GStack_24 == 0x9009)) {
      gl4cts::Texture::Generate(_format_local,&stack0xffffffffffffffd0);
      gl4cts::Texture::Bind(_format_local,GStack_30,GStack_24);
      if (GStack_24 == 0x8c18) {
        gl4cts::Texture::Storage(_format_local,0x8c18,1,texture,8,pageSizeX,0);
      }
      else {
        gl4cts::Texture::Storage(_format_local,GStack_24,1,texture,8,8,pageSizeX);
      }
      GVar5 = (*_format_local->getError)();
      depth._3_1_ = SparseTextureUtils::verifyError(&this->mLog,"TexStorage [case 3]",GVar5,0x502);
      gl4cts::Texture::Delete(_format_local,&stack0xffffffffffffffd0);
    }
    else {
      gl4cts::Texture::Generate(_format_local,&stack0xffffffffffffffd0);
      gl4cts::Texture::Bind(_format_local,GStack_30,GStack_24);
      (*_format_local->texParameteri)(GStack_24,0x91a6,1);
      GVar5 = GStack_24;
      GVar4 = (*_format_local->getError)();
      bVar3 = SparseTextureUtils::verifyQueryError(&this->mLog,"texParameteri",GVar5,0x91a6,GVar4,0)
      ;
      if (!bVar3) {
        return false;
      }
      gl4cts::Texture::Storage(_format_local,GStack_24,1,texture,8,8,pageSizeX);
      GVar5 = (*_format_local->getError)();
      bVar3 = SparseTextureUtils::verifyError(&this->mLog,"TexStorage [sparse texture]",GVar5,0x502)
      ;
      if (!bVar3) {
        gl4cts::Texture::Delete(_format_local,&stack0xffffffffffffffd0);
        return false;
      }
      gl4cts::Texture::Generate(_format_local,&stack0xffffffffffffffd0);
      gl4cts::Texture::Bind(_format_local,GStack_30,GStack_24);
      SparseTextureUtils::getTexturePageSizes
                (_format_local,GStack_24,texture,&pageSizeZ,&levels,&width);
      GVar2 = pageSizeZ;
      dVar6 = pow(2.0,3.0);
      GVar1 = levels;
      dVar7 = pow(2.0,3.0);
      gl4cts::Texture::Storage
                (_format_local,GStack_24,4,texture,GVar2 * (int)dVar6 + pageSizeZ,GVar1 * (int)dVar7
                 ,pageSizeX);
      GVar5 = (*_format_local->getError)();
      depth._3_1_ = SparseTextureUtils::verifyError
                              (&this->mLog,"TexStorage [wrong width]",GVar5,0x502);
      if ((bool)depth._3_1_) {
        gl4cts::Texture::Storage
                  (_format_local,GStack_24,4,texture,GVar2 * (int)dVar6,GVar1 * (int)dVar7 + levels,
                   pageSizeX);
        GVar5 = (*_format_local->getError)();
        depth._3_1_ = SparseTextureUtils::verifyError
                                (&this->mLog,"TexStorage [wrong height]",GVar5,0x502);
      }
      gl4cts::Texture::Delete(_format_local,&stack0xffffffffffffffd0);
    }
  }
  return (bool)(depth._3_1_ & 1);
}

Assistant:

bool SparseTextureAllocationTestCase::verifyTexStorageFullArrayCubeMipmapsError(const Functions& gl, GLint target,
																				GLint format)
{
	mLog << "Verify FullArrayCubeMipmaps errors - ";

	bool result = true;

	GLuint texture;
	GLint  depth;

	depth = SparseTextureUtils::getTargetDepth(target);

	GLboolean fullArrayCubeMipmaps;

	gl.getBooleanv(GL_SPARSE_TEXTURE_FULL_ARRAY_CUBE_MIPMAPS_ARB, &fullArrayCubeMipmaps);
	if (!SparseTextureUtils::verifyQueryError(
			mLog, "getBooleanv", target, GL_SPARSE_TEXTURE_FULL_ARRAY_CUBE_MIPMAPS_ARB, gl.getError(), GL_NO_ERROR))
		return false;

	if (fullArrayCubeMipmaps == GL_FALSE)
	{
		if (target != GL_TEXTURE_1D_ARRAY && target != GL_TEXTURE_2D_ARRAY && target != GL_TEXTURE_CUBE_MAP &&
			target != GL_TEXTURE_CUBE_MAP_ARRAY)
		{
			// Case 1: test GL_TEXTURE_SPARSE_ARB
			Texture::Generate(gl, texture);
			Texture::Bind(gl, texture, target);

			gl.texParameteri(target, GL_TEXTURE_SPARSE_ARB, GL_TRUE);
			if (!SparseTextureUtils::verifyQueryError(mLog, "texParameteri", target, GL_TEXTURE_SPARSE_ARB,
													  gl.getError(), GL_NO_ERROR))
				return false;

			Texture::Storage(gl, target, 1, format, 8, 8, depth);
			if (!SparseTextureUtils::verifyError(mLog, "TexStorage [sparse texture]", gl.getError(),
												 GL_INVALID_OPERATION))
			{
				Texture::Delete(gl, texture);
				return false;
			}

			// Case 2: test wrong texture size
			Texture::Generate(gl, texture);
			Texture::Bind(gl, texture, target);

			GLint pageSizeX;
			GLint pageSizeY;
			GLint pageSizeZ;
			SparseTextureUtils::getTexturePageSizes(gl, target, format, pageSizeX, pageSizeY, pageSizeZ);

			GLint levels = 4;
			GLint width  = pageSizeX * (int)pow(2, levels - 1);
			GLint height = pageSizeY * (int)pow(2, levels - 1);

			// Check 2 different cases:
			// 1) wrong width
			// 2) wrong height
			Texture::Storage(gl, target, levels, format, width + pageSizeX, height, depth);
			result =
				SparseTextureUtils::verifyError(mLog, "TexStorage [wrong width]", gl.getError(), GL_INVALID_OPERATION);

			if (result)
			{
				Texture::Storage(gl, target, levels, format, width, height + pageSizeY, depth);
				result = SparseTextureUtils::verifyError(mLog, "TexStorage [wrong height]", gl.getError(),
														 GL_INVALID_OPERATION);
			}

			Texture::Delete(gl, texture);
		}
		else
		{
			// Case 3: test full array mipmaps targets
			Texture::Generate(gl, texture);
			Texture::Bind(gl, texture, target);

			if (target == GL_TEXTURE_1D_ARRAY)
				Texture::Storage(gl, target, 1, format, 8, depth, 0);
			else
				Texture::Storage(gl, target, 1, format, 8, 8, depth);

			result = SparseTextureUtils::verifyError(mLog, "TexStorage [case 3]", gl.getError(), GL_INVALID_OPERATION);

			Texture::Delete(gl, texture);
		}
	}

	return result;
}